

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# errors.hpp
# Opt level: O0

void __thiscall
camp::EnumNameNotFound::EnumNameNotFound(EnumNameNotFound *this,EnumNameNotFound *param_1)

{
  EnumNameNotFound *param_1_local;
  EnumNameNotFound *this_local;
  
  Error::Error(&this->super_Error,&param_1->super_Error);
  *(undefined ***)&this->super_Error = &PTR__EnumNameNotFound_001fd448;
  return;
}

Assistant:

class CAMP_API EnumNameNotFound : public Error
{
public:

    /**
     * \brief Constructor
     *
     * \param name Name of the requested metaenum member
     * \param enumName Name of the owner metaenum
     */
    EnumNameNotFound(const std::string& name, const std::string& enumName);
}